

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void quantize_ord_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,
                        int num_rows)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  int ci;
  int nc;
  int col_index;
  int row_index;
  int *dither;
  JSAMPROW colorindex_ci;
  JSAMPROW output_ptr;
  JSAMPROW input_ptr;
  my_cquantize_ptr cquantize;
  undefined4 in_stack_ffffffffffffff98;
  int iVar7;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar8;
  int local_58;
  uint local_50;
  char *local_38;
  byte *local_30;
  
  lVar3 = *(long *)(in_RDI + 0x270);
  iVar1 = *(int *)(in_RDI + 0x90);
  iVar7 = *(int *)(in_RDI + 0x88);
  for (iVar8 = 0; iVar8 < in_ECX; iVar8 = iVar8 + 1) {
    jzero_far((void *)CONCAT44(iVar8,in_stack_ffffffffffffffa0),
              CONCAT44(iVar7,in_stack_ffffffffffffff98));
    iVar2 = *(int *)(lVar3 + 0x4c);
    for (local_58 = 0; local_58 < iVar1; local_58 = local_58 + 1) {
      local_30 = (byte *)(*(long *)(in_RSI + (long)iVar8 * 8) + (long)local_58);
      local_38 = *(char **)(in_RDX + (long)iVar8 * 8);
      lVar4 = *(long *)(*(long *)(lVar3 + 0x30) + (long)local_58 * 8);
      lVar5 = *(long *)(lVar3 + 0x50 + (long)local_58 * 8);
      local_50 = 0;
      for (iVar6 = iVar7; iVar6 != 0; iVar6 = iVar6 + -1) {
        *local_38 = *local_38 +
                    *(char *)(lVar4 + (int)((uint)*local_30 +
                                           *(int *)(lVar5 + (long)iVar2 * 0x40 +
                                                   (long)(int)local_50 * 4)));
        local_30 = local_30 + iVar1;
        local_38 = local_38 + 1;
        local_50 = local_50 + 1 & 0xf;
      }
      in_stack_ffffffffffffffa0 = 0;
    }
    *(uint *)(lVar3 + 0x4c) = iVar2 + 1U & 0xf;
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_ord_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                    JSAMPARRAY output_buf, int num_rows)
/* General case, with ordered dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex_ci;
  int *dither;                  /* points to active row of dither matrix */
  int row_index, col_index;     /* current indexes into dither matrix */
  int nc = cinfo->out_color_components;
  int ci;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    /* Initialize output values to 0 so can process components separately */
    jzero_far((void *)output_buf[row], (size_t)(width * sizeof(JSAMPLE)));
    row_index = cquantize->row_index;
    for (ci = 0; ci < nc; ci++) {
      input_ptr = input_buf[row] + ci;
      output_ptr = output_buf[row];
      colorindex_ci = cquantize->colorindex[ci];
      dither = cquantize->odither[ci][row_index];
      col_index = 0;

      for (col = width; col > 0; col--) {
        /* Form pixel value + dither, range-limit to 0..MAXJSAMPLE,
         * select output value, accumulate into output code for this pixel.
         * Range-limiting need not be done explicitly, as we have extended
         * the colorindex table to produce the right answers for out-of-range
         * inputs.  The maximum dither is +- MAXJSAMPLE; this sets the
         * required amount of padding.
         */
        *output_ptr +=
          colorindex_ci[*input_ptr + dither[col_index]];
        input_ptr += nc;
        output_ptr++;
        col_index = (col_index + 1) & ODITHER_MASK;
      }
    }
    /* Advance row index for next row */
    row_index = (row_index + 1) & ODITHER_MASK;
    cquantize->row_index = row_index;
  }
}